

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_inplace_union(bitset_t *b1,bitset_t *b2)

{
  long lVar1;
  _Bool _Var2;
  long *in_RSI;
  long *in_RDI;
  size_t oldsize;
  size_t k;
  size_t minlength;
  ulong local_38;
  ulong local_28;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    local_38 = in_RDI[1];
  }
  else {
    local_38 = in_RSI[1];
  }
  for (local_28 = 0; local_28 < local_38; local_28 = local_28 + 1) {
    *(ulong *)(*in_RDI + local_28 * 8) =
         *(ulong *)(*in_RSI + local_28 * 8) | *(ulong *)(*in_RDI + local_28 * 8);
  }
  if ((ulong)in_RDI[1] < (ulong)in_RSI[1]) {
    lVar1 = in_RDI[1];
    _Var2 = bitset_resize((bitset_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                          (size_t)in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
    if (!_Var2) {
      return false;
    }
    memcpy((void *)(*in_RDI + lVar1 * 8),(void *)(*in_RSI + lVar1 * 8),(in_RSI[1] - lVar1) * 8);
  }
  return true;
}

Assistant:

bool bitset_inplace_union(bitset_t *CROARING_CBITSET_RESTRICT b1,
                          const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;
    for (size_t k = 0; k < minlength; ++k) {
        b1->array[k] |= b2->array[k];
    }
    if (b2->arraysize > b1->arraysize) {
        size_t oldsize = b1->arraysize;
        if (!bitset_resize(b1, b2->arraysize, false)) return false;
        memcpy(b1->array + oldsize, b2->array + oldsize,
               (b2->arraysize - oldsize) * sizeof(uint64_t));
    }
    return true;
}